

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

int32_t ucurr_getDefaultFractionDigitsForUsage_63
                  (UChar *currency,UCurrencyUsage usage,UErrorCode *ec)

{
  int32_t iVar1;
  int32_t *piVar2;
  
  iVar1 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if (usage == UCURR_USAGE_CASH) {
      piVar2 = _findMetaData(currency,ec);
      iVar1 = piVar2[2];
    }
    else if (usage == UCURR_USAGE_STANDARD) {
      piVar2 = _findMetaData(currency,ec);
      iVar1 = *piVar2;
    }
    else {
      *ec = U_UNSUPPORTED_ERROR;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

U_DRAFT int32_t U_EXPORT2
ucurr_getDefaultFractionDigitsForUsage(const UChar* currency, const UCurrencyUsage usage, UErrorCode* ec) {
    int32_t fracDigits = 0;
    if (U_SUCCESS(*ec)) {
        switch (usage) {
            case UCURR_USAGE_STANDARD:
                fracDigits = (_findMetaData(currency, *ec))[0];
                break;
            case UCURR_USAGE_CASH:
                fracDigits = (_findMetaData(currency, *ec))[2];
                break;
            default:
                *ec = U_UNSUPPORTED_ERROR;
        }
    }
    return fracDigits;
}